

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O2

uint64_t HyperLogLog::Fnv64(uint8_t *x,size_t l)

{
  uint64_t uVar1;
  size_t i;
  size_t sVar2;
  
  uVar1 = 0xcbf29ce484222325;
  for (sVar2 = 0; l != sVar2; sVar2 = sVar2 + 1) {
    uVar1 = (uVar1 ^ x[sVar2]) * 0x100000001b3;
  }
  return uVar1;
}

Assistant:

uint64_t HyperLogLog::Fnv64(const uint8_t* x, size_t l)
{
    uint64_t fnv64 = 0xcbf29ce484222325ull;
    const uint64_t fnv64_prime = 0x00000100000001B3ull;

    /* Compute the FNV 64 bit hash */
    for (size_t i = 0; i < l; i++) {
        fnv64 ^= x[i];
        fnv64 *= fnv64_prime;
    }
    return fnv64;
}